

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O3

void __thiscall
YAML::detail::node_data::convert_sequence_to_map(node_data *this,shared_memory_holder *pMemory)

{
  element_type *peVar1;
  node *this_00;
  pointer ppnVar2;
  pointer ppnVar3;
  ulong uVar4;
  stringstream stream;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  reset_map(this);
  ppnVar2 = (this->m_sequence).
            super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppnVar3 = (this->m_sequence).
            super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppnVar3 != ppnVar2) {
    uVar4 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      this_00 = memory::create_node((((pMemory->
                                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->m_pMemory).
                                    super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
      std::__cxx11::stringbuf::str();
      detail::node::mark_defined(this_00);
      peVar1 = (((this_00->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar1->m_isDefined = true;
      peVar1->m_type = Scalar;
      std::__cxx11::string::_M_assign((string *)&peVar1->m_scalar);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      insert_map_pair(this,this_00,
                      (this->m_sequence).
                      super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar4 = uVar4 + 1;
      ppnVar2 = (this->m_sequence).
                super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppnVar3 = (this->m_sequence).
                super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar4 < (ulong)((long)ppnVar3 - (long)ppnVar2 >> 3));
  }
  if (ppnVar3 != ppnVar2) {
    (this->m_sequence).
    super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppnVar2;
  }
  this->m_seqSize = 0;
  this->m_type = Map;
  return;
}

Assistant:

void node_data::convert_sequence_to_map(const shared_memory_holder& pMemory) {
  assert(m_type == NodeType::Sequence);

  reset_map();
  for (std::size_t i = 0; i < m_sequence.size(); i++) {
    std::stringstream stream;
    stream << i;

    node& key = pMemory->create_node();
    key.set_scalar(stream.str());
    insert_map_pair(key, *m_sequence[i]);
  }

  reset_sequence();
  m_type = NodeType::Map;
}